

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O1

void pstore::log<char_const*>(priority p,czstring message,char *d)

{
  long lVar1;
  undefined8 *puVar2;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar3;
  long *in_FS_OFFSET;
  
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar3 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar3[1];
    for (puVar3 = (undefined8 *)*puVar3; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      (**(code **)(*(long *)*puVar3 + 0x50))((long *)*puVar3,p,message,d);
    }
  }
  return;
}

Assistant:

inline void log (logger::priority p, gsl::czstring message, T d) {
            if (details::log_destinations != nullptr) {
                for (std::unique_ptr<logger> & destination : *details::log_destinations) {
                    destination->log (p, message, d);
                }
            }
        }